

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-filter-tokens.cc
# Opt level: O2

void __thiscall StringReverser::handleToken(StringReverser *this,Token *token)

{
  string value;
  Token local_78;
  
  if (token->type == tt_string) {
    std::__cxx11::string::string((string *)&value,(string *)&token->value);
    std::__reverse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              (value._M_dataplus._M_p,value._M_dataplus._M_p + value._M_string_length);
    QPDFTokenizer::Token::Token(&local_78,tt_string,(string *)&value);
    QPDFObjectHandle::TokenFilter::writeToken((Token *)this);
    QPDFTokenizer::Token::~Token(&local_78);
    std::__cxx11::string::~string((string *)&value);
    return;
  }
  QPDFObjectHandle::TokenFilter::writeToken((Token *)this);
  return;
}

Assistant:

void
StringReverser::handleToken(QPDFTokenizer::Token const& token)
{
    // For string tokens, reverse the characters. For other tokens, just pass them through. Notice
    // that we construct a new string token and write that, thus allowing the library to handle any
    // subtleties about properly encoding unprintable characters. This function doesn't handle
    // multibyte characters at all. It's not intended to be an example of the correct way to reverse
    // strings. It's just intended to give a simple example of a pretty minimal filter and to show
    // an example of writing a constructed token.
    if (token.getType() == QPDFTokenizer::tt_string) {
        std::string value = token.getValue();
        std::reverse(value.begin(), value.end());
        writeToken(QPDFTokenizer::Token(QPDFTokenizer::tt_string, value));
    } else {
        writeToken(token);
    }
}